

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

ObjectField *
jsonnet::internal::ObjectField::Local
          (Fodder *fodder1,Fodder *fodder2,Identifier *id,Fodder *op_fodder,AST *body,
          Fodder *comma_fodder)

{
  Fodder *in_RDX;
  Fodder *in_RSI;
  ObjectField *in_RDI;
  LocationRange *in_stack_fffffffffffffe90;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *this;
  ObjectField *fodder_r;
  Fodder *fodder1_00;
  Kind kind;
  ObjectField *in_stack_ffffffffffffff18;
  Hide hide;
  AST *in_stack_ffffffffffffff48;
  Identifier *in_stack_ffffffffffffff50;
  LocationRange *in_stack_ffffffffffffff58;
  ArgParams *in_stack_ffffffffffffff60;
  Fodder *in_stack_ffffffffffffff70;
  AST *in_stack_ffffffffffffff78;
  AST *in_stack_ffffffffffffff80;
  Fodder *in_stack_ffffffffffffff88;
  
  fodder1_00 = (Fodder *)0x0;
  kind = ASSERT;
  fodder_r = in_RDI;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x35c708);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x35c731);
  LocationRange::LocationRange(in_stack_fffffffffffffe90);
  hide = HIDDEN;
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             0x35c779);
  this = (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)0x0;
  ObjectField(in_stack_ffffffffffffff18,kind,fodder1_00,in_RDX,in_RSI,(Fodder *)fodder_r,hide,
              SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0),
              in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
              in_stack_ffffffffffffff60,SUB81((ulong)in_RDI >> 0x28,0),in_stack_ffffffffffffff70,
              in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
            (this);
  LocationRange::~LocationRange((LocationRange *)0x35c83c);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)this);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)this);
  return fodder_r;
}

Assistant:

static ObjectField Local(const Fodder &fodder1, const Fodder &fodder2, const Identifier *id,
                             const Fodder &op_fodder, AST *body, const Fodder &comma_fodder)
    {
        return ObjectField(LOCAL,
                           fodder1,
                           fodder2,
                           Fodder{},
                           Fodder{},
                           VISIBLE,
                           false,
                           false,
                           nullptr,
                           id,
                           LocationRange(),
                           ArgParams{},
                           false,
                           op_fodder,
                           body,
                           nullptr,
                           comma_fodder);
    }